

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O1

void __thiscall AviWriter::~AviWriter(AviWriter *this)

{
  _Map_pointer pppAVar1;
  _Elt_pointer ppAVar2;
  AVIIndexRecord *pAVar3;
  
  if ((FILE *)this->fOutFid != (FILE *)0x0) {
    fclose((FILE *)this->fOutFid);
  }
  pppAVar1 = (this->indexRecords).c.
             super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  ppAVar2 = (this->indexRecords).c.
            super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  if (((long)(this->indexRecords).c.
             super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>._M_impl.
             super__Deque_impl_data._M_start._M_last - (long)ppAVar2 >> 3) +
      ((long)(this->indexRecords).c.
             super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur -
       (long)(this->indexRecords).c.
             super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first >> 3) +
      ((((ulong)((long)pppAVar1 -
                (long)(this->indexRecords).c.
                      super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>._M_impl
                      .super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(pppAVar1 == (_Map_pointer)0x0)) * 0x40 != 0) {
    pAVar3 = *ppAVar2;
    if (pAVar3 != (AVIIndexRecord *)0x0) {
      operator_delete(pAVar3,0x10);
    }
    std::deque<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>::pop_front
              (&(this->indexRecords).c);
  }
  std::_Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>::~_Deque_base
            ((_Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_> *)&this->indexRecords
            );
  return;
}

Assistant:

AviWriter::~AviWriter()
{
    if (fOutFid != NULL)
        fclose(fOutFid);

    if (indexRecords.size())
    {
        auto record = indexRecords.front();
        delete record;
        indexRecords.pop();
    }
}